

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c0_compile_mips.cpp
# Opt level: O0

void __thiscall MipsGenerator::TranslateMULType(MipsGenerator *this,Pcode *item)

{
  int iVar1;
  char *pcVar2;
  allocator local_531;
  string local_530;
  allocator local_509;
  string local_508;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_488;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_468;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_448;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_428;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_408;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_388;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_368;
  allocator local_341;
  string local_340 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_320;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_300;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  allocator local_219;
  string local_218 [32];
  string local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  int local_178;
  allocator local_171;
  int value;
  int local_150;
  allocator local_149;
  int ret3;
  int local_128;
  allocator local_121;
  int ret2;
  int local_100;
  allocator local_f9;
  int ret1;
  allocator local_d1;
  string local_d0 [32];
  undefined1 local_b0 [8];
  string op;
  undefined1 local_88 [4];
  PcodeType op_type;
  string num3;
  undefined1 local_58 [8];
  string num2;
  string num1;
  Pcode *item_local;
  MipsGenerator *this_local;
  
  Pcode::GetNum1_abi_cxx11_((string *)((long)&num2.field_2 + 8),item);
  Pcode::GetNum2_abi_cxx11_((string *)local_58,item);
  Pcode::GetNum3_abi_cxx11_((string *)local_88,item);
  op.field_2._12_4_ = Pcode::GetOP(item);
  std::__cxx11::string::string((string *)local_b0);
  if (op.field_2._12_4_ == 2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_d0,"mul ",&local_d1);
    std::__cxx11::string::operator=((string *)local_b0,local_d0);
    std::__cxx11::string::~string(local_d0);
    std::allocator<char>::~allocator((allocator<char> *)&local_d1);
  }
  else if (op.field_2._12_4_ == 3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&ret1,"div ",&local_f9);
    std::__cxx11::string::operator=((string *)local_b0,(string *)&ret1);
    std::__cxx11::string::~string((string *)&ret1);
    std::allocator<char>::~allocator((allocator<char> *)&local_f9);
  }
  else {
    fprintf(_stderr,"invalid mul type\n");
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&ret2,"$25",&local_121);
  iVar1 = PrepareStoreREG(this,(string *)((long)&num2.field_2 + 8),&reg1_abi_cxx11_,(string *)&ret2)
  ;
  std::__cxx11::string::~string((string *)&ret2);
  std::allocator<char>::~allocator((allocator<char> *)&local_121);
  local_100 = iVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&ret3,"$26",&local_149);
  iVar1 = PrepareLoadREG(this,(string *)local_58,&reg2_abi_cxx11_,(string *)&ret3);
  std::__cxx11::string::~string((string *)&ret3);
  std::allocator<char>::~allocator((allocator<char> *)&local_149);
  local_128 = iVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&value,"$27",&local_171);
  iVar1 = PrepareLoadREG(this,(string *)local_88,&reg3_abi_cxx11_,(string *)&value);
  std::__cxx11::string::~string((string *)&value);
  std::allocator<char>::~allocator((allocator<char> *)&local_171);
  local_150 = iVar1;
  if ((local_128 == -1) && (iVar1 == -1)) {
    if (op.field_2._12_4_ == 2) {
      pcVar2 = (char *)std::__cxx11::string::c_str();
      iVar1 = atoi(pcVar2);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      local_178 = atoi(pcVar2);
      local_178 = iVar1 * local_178;
    }
    else {
      pcVar2 = (char *)std::__cxx11::string::c_str();
      iVar1 = atoi(pcVar2);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      local_178 = atoi(pcVar2);
      local_178 = iVar1 / local_178;
    }
    std::operator+(&local_1d8,"li ",&reg1_abi_cxx11_);
    std::operator+(&local_1b8,&local_1d8," ");
    std::__cxx11::to_string(&local_1f8,local_178);
    std::operator+(&local_198,&local_1b8,&local_1f8);
    Output2File(this,&local_198);
    std::__cxx11::string::~string((string *)&local_198);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::__cxx11::string::~string((string *)&local_1b8);
    std::__cxx11::string::~string((string *)&local_1d8);
  }
  else if (local_128 == -1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_218,"$26",&local_219);
    std::__cxx11::string::operator=((string *)&reg2_abi_cxx11_,local_218);
    std::__cxx11::string::~string(local_218);
    std::allocator<char>::~allocator((allocator<char> *)&local_219);
    std::operator+(&local_280,"li ",&reg2_abi_cxx11_);
    std::operator+(&local_260,&local_280," ");
    std::operator+(&local_240,&local_260,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58);
    Output2File(this,&local_240);
    std::__cxx11::string::~string((string *)&local_240);
    std::__cxx11::string::~string((string *)&local_260);
    std::__cxx11::string::~string((string *)&local_280);
    std::operator+(&local_320,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0,
                   &reg1_abi_cxx11_);
    std::operator+(&local_300,&local_320," ");
    std::operator+(&local_2e0,&local_300,&reg2_abi_cxx11_);
    std::operator+(&local_2c0,&local_2e0," ");
    std::operator+(&local_2a0,&local_2c0,&reg3_abi_cxx11_);
    Output2File(this,&local_2a0);
    std::__cxx11::string::~string((string *)&local_2a0);
    std::__cxx11::string::~string((string *)&local_2c0);
    std::__cxx11::string::~string((string *)&local_2e0);
    std::__cxx11::string::~string((string *)&local_300);
    std::__cxx11::string::~string((string *)&local_320);
  }
  else if (iVar1 == -1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_340,"$27",&local_341);
    std::__cxx11::string::operator=((string *)&reg3_abi_cxx11_,local_340);
    std::__cxx11::string::~string(local_340);
    std::allocator<char>::~allocator((allocator<char> *)&local_341);
    std::operator+(&local_3a8,"li ",&reg3_abi_cxx11_);
    std::operator+(&local_388,&local_3a8," ");
    std::operator+(&local_368,&local_388,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88);
    Output2File(this,&local_368);
    std::__cxx11::string::~string((string *)&local_368);
    std::__cxx11::string::~string((string *)&local_388);
    std::__cxx11::string::~string((string *)&local_3a8);
    std::operator+(&local_448,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0,
                   &reg1_abi_cxx11_);
    std::operator+(&local_428,&local_448," ");
    std::operator+(&local_408,&local_428,&reg2_abi_cxx11_);
    std::operator+(&local_3e8,&local_408," ");
    std::operator+(&local_3c8,&local_3e8,&reg3_abi_cxx11_);
    Output2File(this,&local_3c8);
    std::__cxx11::string::~string((string *)&local_3c8);
    std::__cxx11::string::~string((string *)&local_3e8);
    std::__cxx11::string::~string((string *)&local_408);
    std::__cxx11::string::~string((string *)&local_428);
    std::__cxx11::string::~string((string *)&local_448);
  }
  else {
    std::operator+(&local_4e8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0,
                   &reg1_abi_cxx11_);
    std::operator+(&local_4c8,&local_4e8," ");
    std::operator+(&local_4a8,&local_4c8,&reg2_abi_cxx11_);
    std::operator+(&local_488,&local_4a8," ");
    std::operator+(&local_468,&local_488,&reg3_abi_cxx11_);
    Output2File(this,&local_468);
    std::__cxx11::string::~string((string *)&local_468);
    std::__cxx11::string::~string((string *)&local_488);
    std::__cxx11::string::~string((string *)&local_4a8);
    std::__cxx11::string::~string((string *)&local_4c8);
    std::__cxx11::string::~string((string *)&local_4e8);
  }
  if (local_100 == 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_508,"",&local_509);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_530,"t",&local_531);
    GenerateStore(this,&reg1_abi_cxx11_,(string *)((long)&num2.field_2 + 8),&local_508,&local_530);
    std::__cxx11::string::~string((string *)&local_530);
    std::allocator<char>::~allocator((allocator<char> *)&local_531);
    std::__cxx11::string::~string((string *)&local_508);
    std::allocator<char>::~allocator((allocator<char> *)&local_509);
  }
  std::__cxx11::string::~string((string *)local_b0);
  std::__cxx11::string::~string((string *)local_88);
  std::__cxx11::string::~string((string *)local_58);
  std::__cxx11::string::~string((string *)(num2.field_2._M_local_buf + 8));
  return;
}

Assistant:

void MipsGenerator::TranslateMULType(Pcode& item) {
    string num1 = item.GetNum1();
    string num2 = item.GetNum2();
    string num3 = item.GetNum3();
    PcodeType op_type = item.GetOP();
    string op;
    if (op_type == MUL)
        op = string("mul ");
    else if (op_type == DIV)
        op = string("div ");
    else
        fprintf(stderr, "invalid mul type\n");
    int ret1 = PrepareStoreREG(num1, reg1, NUM1);
    int ret2 = PrepareLoadREG(num2, reg2, NUM2);
    int ret3 = PrepareLoadREG(num3, reg3, NUM3);
    if (ret2 == -1 && ret3 == -1) {
        int value;
        if (op_type == MUL)
            value = atoi(num2.c_str()) * atoi(num3.c_str());
        else
            value = atoi(num2.c_str()) / atoi(num3.c_str());
        Output2File("li " + reg1 + " " + std::to_string(value));
    } else if (ret2 == -1) {
        reg2 = NUM2;
        Output2File("li " + reg2 + " " + num2);
        Output2File(op + reg1 + " " + reg2 + " " + reg3);
    } else if (ret3 == -1) {
        reg3 = NUM3;
        Output2File("li " + reg3 + " " + num3);
        Output2File(op + reg1 + " " + reg2 + " " + reg3);
    } else {
        Output2File(op + reg1 + " " + reg2 + " " + reg3);
    }
    if (ret1 == 1) {
        GenerateStore(reg1, num1, "", TMP);
    }
}